

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_order.cpp
# Opt level: O2

void __thiscall
duckdb::OrderLocalSinkState::OrderLocalSinkState
          (OrderLocalSinkState *this,ClientContext *context,PhysicalOrder *op)

{
  pointer pBVar1;
  vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_> *pvVar2;
  pointer pEVar3;
  type expr;
  Allocator *allocator;
  pointer pBVar4;
  vector<duckdb::LogicalType,_true> key_types;
  undefined1 local_48 [16];
  pointer local_38;
  
  *(undefined4 *)&(this->super_LocalSinkState).partition_info.batch_index.index = 0xffffffff;
  *(undefined4 *)((long)&(this->super_LocalSinkState).partition_info.batch_index.index + 4) =
       0xffffffff;
  *(undefined4 *)&(this->super_LocalSinkState).partition_info.min_batch_index.index = 0xffffffff;
  *(undefined4 *)((long)&(this->super_LocalSinkState).partition_info.min_batch_index.index + 4) =
       0xffffffff;
  pvVar2 = &(this->super_LocalSinkState).partition_info.partition_data.
            super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>;
  (pvVar2->
  super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar2->
  super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_LocalSinkState).partition_info.partition_data.
           super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
           super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
           ._M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->super_LocalSinkState)._vptr_LocalSinkState =
       (_func_int **)&PTR__OrderLocalSinkState_027bb390;
  LocalSortState::LocalSortState(&this->local_sort_state);
  ExpressionExecutor::ExpressionExecutor(&this->key_executor,context);
  DataChunk::DataChunk(&this->keys);
  DataChunk::DataChunk(&this->payload);
  local_38 = (pointer)0x0;
  local_48 = (undefined1  [16])0x0;
  pBVar1 = (op->orders).
           super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
           super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pBVar4 = (op->orders).
                super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
                super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                ._M_impl.super__Vector_impl_data._M_start; pBVar4 != pBVar1; pBVar4 = pBVar4 + 1) {
    pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(&pBVar4->expression);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_48,
               &pEVar3->return_type);
    expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     (&pBVar4->expression);
    ExpressionExecutor::AddExpression(&this->key_executor,expr);
  }
  allocator = Allocator::Get(context);
  DataChunk::Initialize(&this->keys,allocator,(vector<duckdb::LogicalType,_true> *)local_48,0x800);
  DataChunk::Initialize(&this->payload,allocator,&(op->super_PhysicalOperator).types,0x800);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_48);
  return;
}

Assistant:

OrderLocalSinkState(ClientContext &context, const PhysicalOrder &op) : key_executor(context) {
		// Initialize order clause expression executor and DataChunk
		vector<LogicalType> key_types;
		for (auto &order : op.orders) {
			key_types.push_back(order.expression->return_type);
			key_executor.AddExpression(*order.expression);
		}
		auto &allocator = Allocator::Get(context);
		keys.Initialize(allocator, key_types);
		payload.Initialize(allocator, op.types);
	}